

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

bool __thiscall Minisat::Solver::addClause_(Solver *this,vec<Minisat::Lit> *ps)

{
  Lit *pLVar1;
  lbool *plVar2;
  FILE *__stream;
  uchar *puVar3;
  byte *pbVar4;
  int iVar5;
  CRef CVar6;
  undefined8 in_RAX;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  byte bVar12;
  byte bVar13;
  uint uVar14;
  byte bVar15;
  long lVar16;
  long lVar17;
  byte bVar18;
  byte bVar19;
  bool bVar20;
  CRef cr;
  undefined8 uStack_38;
  
  if (this->ok != true) {
    return false;
  }
  uStack_38 = in_RAX;
  if (this->check_satisfiability == true) {
    SATchecker::addClause(&this->satChecker,ps);
  }
  sort<Minisat::Lit,Minisat::LessThan_default<Minisat::Lit>>(ps->data);
  if (this->drup_file == (FILE *)0x0) {
    iVar5 = ps->sz;
LAB_00114e76:
    if (0 < iVar5) {
      pLVar1 = ps->data;
      plVar2 = (this->assigns).data;
      lVar16 = 0;
      iVar8 = 0;
      bVar12 = 0;
      uVar14 = 0xfffffffe;
      bVar13 = 0;
      do {
        uVar10 = pLVar1[lVar16].x;
        bVar15 = plVar2[(int)uVar10 >> 1].value;
        bVar18 = (byte)uVar10 & 1;
        if (bVar15 == bVar18) {
          return true;
        }
        if ((uVar10 ^ uVar14) == 1) {
          return true;
        }
        bVar15 = bVar15 ^ bVar18;
        if ((bVar15 == 1) || (uVar10 == uVar14)) {
          uVar10 = uVar14;
          bVar19 = bVar13;
          if (bVar15 == 1) {
            bVar19 = bVar18 ^ 1;
            if (bVar13 != 0) {
              bVar19 = 1;
            }
            bVar20 = bVar12 != 0;
            bVar12 = bVar18;
            if (bVar20) {
              bVar12 = 1;
            }
          }
        }
        else {
          lVar17 = (long)iVar8;
          iVar8 = iVar8 + 1;
          pLVar1[lVar17].x = uVar10;
          bVar19 = bVar18 ^ 1;
          if (bVar13 != 0) {
            bVar19 = 1;
          }
          bVar20 = bVar12 != 0;
          bVar12 = bVar18;
          if (bVar20) {
            bVar12 = 1;
          }
        }
        lVar16 = lVar16 + 1;
        iVar5 = ps->sz;
        uVar14 = uVar10;
        bVar13 = bVar19;
      } while (lVar16 < iVar5);
      uVar10 = (uint)(~bVar19 & 1);
      uVar14 = (uint)(~bVar12 & 1);
      goto LAB_00114f66;
    }
  }
  else {
    if ((this->add_oc).data != (Lit *)0x0) {
      (this->add_oc).sz = 0;
    }
    iVar5 = ps->sz;
    if (0 < iVar5) {
      lVar16 = 0;
      lVar17 = 0;
      do {
        vec<Minisat::Lit>::push(&this->add_oc,(Lit *)((long)&ps->data->x + lVar16));
        lVar17 = lVar17 + 1;
        iVar5 = ps->sz;
        lVar16 = lVar16 + 4;
      } while (lVar17 < iVar5);
      goto LAB_00114e76;
    }
  }
  iVar8 = 0;
  uVar14 = 1;
  uVar10 = 1;
  lVar16 = 0;
LAB_00114f66:
  iVar11 = (int)lVar16;
  if (iVar11 - iVar8 != 0 && iVar8 <= iVar11) {
    ps->sz = iVar5 - (iVar11 - iVar8);
  }
  this->solved_by_ls = false;
  if (iVar11 != iVar8 && this->drup_file != (FILE *)0x0) {
    binDRUP<Minisat::vec<Minisat::Lit>>(this,'a',ps,this->drup_file);
    __stream = (FILE *)this->drup_file;
    puVar3 = this->buf_ptr;
    this->buf_ptr = puVar3 + 1;
    *puVar3 = 'd';
    this->buf_len = this->buf_len + 1;
    if ((this->onlineDratChecker != (OnlineProofChecker *)0x0) &&
       (bVar20 = OnlineProofChecker::removeClause<Minisat::vec<Minisat::Lit>>
                           (this->onlineDratChecker,&this->add_oc), !bVar20)) {
      exit(0x86);
    }
    if (0 < (this->add_oc).sz) {
      lVar16 = 0;
      do {
        uVar7 = (this->add_oc).data[lVar16].x + 2;
        uVar9 = (ulong)uVar7;
        do {
          pbVar4 = this->buf_ptr;
          this->buf_ptr = pbVar4 + 1;
          *pbVar4 = (byte)uVar7 | 0x80;
          this->buf_len = this->buf_len + 1;
          uVar9 = uVar9 >> 7;
          bVar20 = 0x7f < uVar7;
          uVar7 = (uint)uVar9;
        } while (bVar20);
        this->buf_ptr[-1] = this->buf_ptr[-1] & 0x7f;
        lVar16 = lVar16 + 1;
      } while (lVar16 < (this->add_oc).sz);
    }
    puVar3 = this->buf_ptr;
    this->buf_ptr = puVar3 + 1;
    *puVar3 = '\0';
    iVar5 = this->buf_len;
    uVar7 = iVar5 + 1;
    this->buf_len = uVar7;
    if (0xfffff < iVar5) {
      fwrite_unlocked(drup_buf,1,(ulong)uVar7,__stream);
      this->buf_ptr = drup_buf;
      this->buf_len = 0;
    }
  }
  if (ps->sz == 1) {
    uncheckedEnqueue(this,(Lit)ps->data->x,0,0xffffffff);
    CVar6 = propagate(this);
    this->ok = CVar6 == 0xffffffff;
    return CVar6 == 0xffffffff;
  }
  if (ps->sz == 0) {
    this->ok = false;
    return false;
  }
  uStack_38._4_4_ = ClauseAllocator::alloc<Minisat::vec<Minisat::Lit>>(&this->ca,ps,false);
  vec<unsigned_int>::push(&this->clauses,(uint *)((long)&uStack_38 + 4));
  attachClause(this,uStack_38._4_4_);
  if (this->systematic_branching_state == 0) {
    this->posMissingInSome = this->posMissingInSome + uVar10;
    this->negMissingInSome = this->negMissingInSome + uVar14;
  }
  return true;
}

Assistant:

bool Solver::addClause_(vec<Lit> &ps)
{
    assert(decisionLevel() == 0);
    if (!ok) return false;

    if (check_satisfiability) satChecker.addClause(ps); // add for SAT check tracking

    // Check if clause is satisfied and remove false/duplicate literals:
    sort(ps);
    Lit p;
    int i, j;

    bool somePositive = false;
    bool someNegative = false;

    TRACE(if (verbosity > 2) std::cout << "c adding clause " << ps << std::endl);

    if (drup_file) {
        add_oc.clear();
        for (int i = 0; i < ps.size(); i++) add_oc.push(ps[i]);
    }

    for (i = j = 0, p = lit_Undef; i < ps.size(); i++)
        if (value(ps[i]) == l_True || ps[i] == ~p)
            return true;
        else if (value(ps[i]) != l_False && ps[i] != p) {
            ps[j++] = p = ps[i];
            somePositive = somePositive || !sign(p);
            someNegative = someNegative || sign(p);
        } else if (value(ps[i]) == l_False) {
            // for polarity analysis, we ignore unit propagation
            somePositive = somePositive || !sign(ps[i]);
            someNegative = someNegative || sign(ps[i]);
        }
    ps.shrink(i - j);

    /* if there are new clauses, we cannot claim that SLS solved the formula anymore */
    solved_by_ls = false;

    if (drup_file && i != j) {
#ifdef BIN_DRUP
        binDRUP('a', ps, drup_file);
        binDRUP('d', add_oc, drup_file);
#else
        for (int i = 0; i < ps.size(); i++) fprintf(drup_file, "%i ", (var(ps[i]) + 1) * (-2 * sign(ps[i]) + 1));
        fprintf(drup_file, "0\n");

        fprintf(drup_file, "d ");
        for (int i = 0; i < add_oc.size(); i++)
            fprintf(drup_file, "%i ", (var(add_oc[i]) + 1) * (-2 * sign(add_oc[i]) + 1));
        fprintf(drup_file, "0\n");
#endif
    }

    if (ps.size() == 0)
        return ok = false;
    else if (ps.size() == 1) {
        uncheckedEnqueue(ps[0], 0);
        return ok = (propagate() == CRef_Undef);
    } else {
        CRef cr = ca.alloc(ps, false);
        clauses.push(cr);
        attachClause(cr);
        // memorize for the whole formula to feed polarity heuristic
        if (systematic_branching_state == 0) {
            posMissingInSome = somePositive ? posMissingInSome : posMissingInSome + 1;
            negMissingInSome = someNegative ? negMissingInSome : negMissingInSome + 1;
        }
    }

    return true;
}